

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z2.c
# Opt level: O0

LispPTR N_OP_clfmemb(LispPTR item,LispPTR list)

{
  uint uVar1;
  LispPTR LVar2;
  uint local_14;
  LispPTR list_local;
  LispPTR item_local;
  
  uVar1 = item & 0xfff0000;
  local_14 = list;
  if ((((uVar1 == 0) || (uVar1 == 0x70000)) || (uVar1 == 0xe0000)) || (uVar1 == 0xf0000)) {
    do {
      if ((*(ushort *)((ulong)(MDStypetbl + (local_14 >> 9)) ^ 2) & 0x7ff) != 5) {
        if (local_14 != 0) {
          MachineState.tosvalue = local_14;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        return 0;
      }
      LVar2 = car(local_14);
      if (item == LVar2) {
        return local_14;
      }
      local_14 = cdr(local_14);
    } while (MachineState.irqend != 0);
    list_local = 0xfffffffe;
    MachineState.tosvalue = local_14;
  }
  else {
    list_local = 0xffffffff;
    MachineState.tosvalue = list;
  }
  MachineState.errorexit = 1;
  return list_local;
}

Assistant:

LispPTR N_OP_clfmemb(LispPTR item, LispPTR list) { /* OP 35Q */

  switch (item & SEGMASK) {
    case S_POSITIVE: break;
    case S_NEGATIVE: break;
    case S_CHARACTER: break;
    case ATOM_OFFSET: break;
    default: ERROR_EXIT(list);
  }
  /* JRB - Don Charnley claims the code below should be identical to IL:FMEMB,
        so I copied it */

  while (Listp(list)) {
    if (item == car(list)) return list;
    list = cdr(list);
    /* if we get an interrupt, punt so we can handle it safely */
    if (!Irq_Stk_End) {
      TopOfStack = list; /* for continuation */
      TIMER_EXIT(list);
    }
  }
  if (list) ERROR_EXIT(list);
  return list;

}